

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

u16 computeNumericType(Mem *pMem)

{
  int iVar1;
  MemValue local_28;
  sqlite3_int64 ix;
  Mem *pMStack_18;
  int rc;
  Mem *pMem_local;
  
  pMStack_18 = pMem;
  if (((pMem->flags & 0x400) == 0) || (iVar1 = sqlite3VdbeMemExpandBlob(pMem), iVar1 == 0)) {
    ix._4_4_ = sqlite3AtoF(pMStack_18->z,(double *)pMStack_18,pMStack_18->n,pMStack_18->enc);
    if (ix._4_4_ < 1) {
      if ((ix._4_4_ == 0) &&
         (iVar1 = sqlite3Atoi64(pMStack_18->z,&local_28.i,pMStack_18->n,pMStack_18->enc), iVar1 < 2)
         ) {
        pMStack_18->u = local_28;
        pMem_local._6_2_ = 4;
      }
      else {
        pMem_local._6_2_ = 8;
      }
    }
    else if ((ix._4_4_ == 1) &&
            (iVar1 = sqlite3Atoi64(pMStack_18->z,&local_28.i,pMStack_18->n,pMStack_18->enc),
            iVar1 == 0)) {
      pMStack_18->u = local_28;
      pMem_local._6_2_ = 4;
    }
    else {
      pMem_local._6_2_ = 8;
    }
  }
  else {
    (pMStack_18->u).r = 0.0;
    pMem_local._6_2_ = 4;
  }
  return pMem_local._6_2_;
}

Assistant:

static u16 SQLITE_NOINLINE computeNumericType(Mem *pMem){
  int rc;
  sqlite3_int64 ix;
  assert( (pMem->flags & (MEM_Int|MEM_Real|MEM_IntReal))==0 );
  assert( (pMem->flags & (MEM_Str|MEM_Blob))!=0 );
  if( ExpandBlob(pMem) ){
    pMem->u.i = 0;
    return MEM_Int;
  }
  rc = sqlite3AtoF(pMem->z, &pMem->u.r, pMem->n, pMem->enc);
  if( rc<=0 ){
    if( rc==0 && sqlite3Atoi64(pMem->z, &ix, pMem->n, pMem->enc)<=1 ){
      pMem->u.i = ix;
      return MEM_Int;
    }else{
      return MEM_Real;
    }
  }else if( rc==1 && sqlite3Atoi64(pMem->z, &ix, pMem->n, pMem->enc)==0 ){
    pMem->u.i = ix;
    return MEM_Int;
  }
  return MEM_Real;
}